

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qualmodel.cpp
# Opt level: O1

QualModel * QualModel::factory(string *model)

{
  int iVar1;
  ChemModel *this;
  undefined *puVar2;
  
  iVar1 = std::__cxx11::string::compare((char *)model);
  if (iVar1 == 0) {
    this = (ChemModel *)operator_new(0x68);
    ChemModel::ChemModel(this);
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)model);
    if (iVar1 == 0) {
      this = (ChemModel *)operator_new(0x18);
      (this->super_QualModel).type = 2;
      puVar2 = &TraceModel::vtable;
    }
    else {
      iVar1 = std::__cxx11::string::compare((char *)model);
      if (iVar1 != 0) {
        return (QualModel *)0x0;
      }
      this = (ChemModel *)operator_new(0x10);
      (this->super_QualModel).type = 1;
      puVar2 = &AgeModel::vtable;
    }
    (this->super_QualModel)._vptr_QualModel = (_func_int **)(puVar2 + 0x10);
  }
  return &this->super_QualModel;
}

Assistant:

QualModel* QualModel::factory(const string model)
{
    if ( model == "CHEMICAL" ) return new ChemModel();
    if ( model == "TRACE" )    return new TraceModel();
    if ( model == "AGE" )      return new AgeModel();
    return nullptr;
}